

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O1

bool __thiscall
ObjectIdentifier::DecodeLong
          (ObjectIdentifier *this,uchar *in,size_t cbIn,unsigned_long *out,size_t *cbRead)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if (cbIn == 0) {
    iVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar2 = 5;
    if (cbIn - 1 < 5) {
      uVar2 = cbIn - 1;
    }
    iVar3 = (int)uVar2 + 1;
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar4 = in[lVar5] & 0x7f | uVar4;
      if (-1 < (char)in[lVar5]) {
        iVar3 = (int)lVar5;
        break;
      }
      uVar4 = uVar4 << 7;
      lVar5 = lVar5 + 1;
    } while (uVar2 + 1 != lVar5);
  }
  bVar1 = uVar4 >> 0x20 == 0;
  if (bVar1 && iVar3 != 6) {
    *out = uVar4;
    *cbRead = (ulong)(iVar3 + 1);
  }
  return bVar1 && iVar3 != 6;
}

Assistant:

bool ObjectIdentifier::DecodeLong(const unsigned char * in, size_t cbIn, unsigned long & out, size_t & cbRead) const
{
	unsigned long long tmp = 0;

	unsigned int i;
	for (i = 0; i < cbIn && i < 6; ++i)
	{
		// we can't possibly overflow a 64-bit value with only 42 bits of input
		tmp += 0x7f & in[i];

		if ((in[i] & 0x80) == 0)
			break;

		tmp <<= 7;
	}

	if (tmp >> 32 != 0 || i == 6)
	{
		// malformed input
		return false;
	}

	out = static_cast<unsigned long>(tmp);
	cbRead = i + 1;
	return true;
}